

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_array.c
# Opt level: O0

void * array_rangeop_new(_class *class,t_symbol *s,int *argcp,t_atom **argvp,int onsetin,int nin,
                        int warnextra)

{
  short sVar1;
  short sVar2;
  undefined2 uVar3;
  int iVar4;
  t_object *owner;
  t_symbol *ptVar5;
  _inlet *p_Var6;
  char *pcVar7;
  bool bVar8;
  t_array_rangeop *x;
  t_atom *argv;
  int argc;
  int nin_local;
  int onsetin_local;
  t_atom **argvp_local;
  int *argcp_local;
  t_symbol *s_local;
  _class *class_local;
  
  argv._4_4_ = *argcp;
  x = (t_array_rangeop *)*argvp;
  owner = (t_object *)pd_new(class);
  owner[1].te_xpix = 0;
  owner[1].te_ypix = 0;
  owner[1].te_width = 0;
  *(undefined2 *)&owner[1].field_0x2e = 0;
  owner[1].te_inlet = (_inlet *)0x0;
  owner[1].te_g.g_pd = (t_pd)0x0;
  gpointer_init((t_gpointer *)&owner[1].te_g.g_next);
  owner[2].te_outlet = (_outlet *)&s_;
  ptVar5 = gensym("y");
  owner[2].te_binbuf = (_binbuf *)ptVar5;
  *(undefined4 *)&owner[2].te_g.g_next = 0;
  *(undefined4 *)((long)&owner[2].te_g.g_next + 4) = 0xbf800000;
  if (onsetin != 0) {
    floatinlet_new(owner,(t_float *)&owner[2].te_g.g_next);
  }
  if (nin != 0) {
    floatinlet_new(owner,(t_float *)((long)&owner[2].te_g.g_next + 4));
  }
  while( true ) {
    bVar8 = false;
    if ((argv._4_4_ != 0) && (bVar8 = false, *(int *)&(x->x_tc).tc_obj.te_g.g_pd == 2)) {
      bVar8 = *(char *)&((x->x_tc).tc_obj.te_g.g_next)->g_pd->c_name == '-';
    }
    if (!bVar8) break;
    iVar4 = strcmp((char *)((x->x_tc).tc_obj.te_g.g_next)->g_pd,"-s");
    if ((((iVar4 == 0) && (2 < argv._4_4_)) && (*(int *)&(x->x_tc).tc_obj.te_binbuf == 2)) &&
       (*(int *)&(x->x_tc).tc_obj.te_inlet == 2)) {
      p_Var6 = (_inlet *)canvas_makebindsym((t_symbol *)(x->x_tc).tc_obj.te_outlet);
      owner[1].te_inlet = p_Var6;
      sVar1 = (x->x_tc).tc_obj.te_ypix;
      sVar2 = (x->x_tc).tc_obj.te_width;
      uVar3 = *(undefined2 *)&(x->x_tc).tc_obj.field_0x2e;
      owner[1].te_xpix = (x->x_tc).tc_obj.te_xpix;
      owner[1].te_ypix = sVar1;
      owner[1].te_width = sVar2;
      *(undefined2 *)&owner[1].field_0x2e = uVar3;
      argv._4_4_ = argv._4_4_ + -2;
      x = (t_array_rangeop *)&(x->x_tc).tc_obj.te_inlet;
    }
    else {
      iVar4 = strcmp((char *)((x->x_tc).tc_obj.te_g.g_next)->g_pd,"-f");
      if (((iVar4 == 0) && (2 < argv._4_4_)) &&
         ((*(int *)&(x->x_tc).tc_obj.te_binbuf == 2 && (*(int *)&(x->x_tc).tc_obj.te_inlet == 2))))
      {
        owner[2].te_outlet = (x->x_tc).tc_obj.te_outlet;
        owner[2].te_binbuf = *(_binbuf **)&(x->x_tc).tc_obj.te_xpix;
        argv._4_4_ = argv._4_4_ + -2;
        x = (t_array_rangeop *)&(x->x_tc).tc_obj.te_inlet;
      }
      else {
        pcVar7 = class_getname(class);
        pd_error(owner,"%s: unknown flag ...",pcVar7);
        postatom(argv._4_4_,(t_atom *)x);
        endpost();
      }
    }
    argv._4_4_ = argv._4_4_ + -1;
    x = (t_array_rangeop *)&(x->x_tc).tc_obj.te_binbuf;
  }
  if ((argv._4_4_ != 0) && (*(int *)&(x->x_tc).tc_obj.te_g.g_pd == 2)) {
    if (owner[1].te_inlet == (_inlet *)0x0) {
      owner[1].te_g.g_pd = (t_pd)(x->x_tc).tc_obj.te_g.g_next;
    }
    else {
      pcVar7 = class_getname(class);
      pd_error(owner,"%s: extra names after -s..",pcVar7);
      postatom(argv._4_4_,(t_atom *)x);
      endpost();
    }
    argv._4_4_ = argv._4_4_ + -1;
    x = (t_array_rangeop *)&(x->x_tc).tc_obj.te_binbuf;
  }
  if ((argv._4_4_ != 0) && (*(int *)&(x->x_tc).tc_obj.te_g.g_pd == 1)) {
    *(undefined4 *)&owner[2].te_g.g_next = *(undefined4 *)&(x->x_tc).tc_obj.te_g.g_next;
    argv._4_4_ = argv._4_4_ + -1;
    x = (t_array_rangeop *)&(x->x_tc).tc_obj.te_binbuf;
  }
  if ((argv._4_4_ != 0) && (*(int *)&(x->x_tc).tc_obj.te_g.g_pd == 1)) {
    *(undefined4 *)((long)&owner[2].te_g.g_next + 4) = *(undefined4 *)&(x->x_tc).tc_obj.te_g.g_next;
    argv._4_4_ = argv._4_4_ + -1;
    x = (t_array_rangeop *)&(x->x_tc).tc_obj.te_binbuf;
  }
  if ((argv._4_4_ != 0) && (warnextra != 0)) {
    pcVar7 = class_getname(class);
    post("warning: %s ignoring extra argument: ",pcVar7);
    postatom(argv._4_4_,(t_atom *)x);
    endpost();
  }
  if (owner[1].te_inlet == (_inlet *)0x0) {
    symbolinlet_new(owner,(t_symbol **)(owner + 1));
  }
  else {
    pointerinlet_new(owner,(t_gpointer *)&owner[1].te_g.g_next);
  }
  *argcp = argv._4_4_;
  *argvp = (t_atom *)x;
  return owner;
}

Assistant:

static void *array_rangeop_new(t_class *class,
    t_symbol *s, int *argcp, t_atom **argvp,
    int onsetin, int nin, int warnextra)
{
    int argc = *argcp;
    t_atom *argv = *argvp;
    t_array_rangeop *x = (t_array_rangeop *)pd_new(class);
    x->x_sym = x->x_struct = x->x_field = 0;
    gpointer_init(&x->x_gp);
    x->x_elemtemplate = &s_;
    x->x_elemfield = gensym("y");
    x->x_onset = 0;
    x->x_n = -1;
    if (onsetin)
        floatinlet_new(&x->x_tc.tc_obj, &x->x_onset);
    if (nin)
        floatinlet_new(&x->x_tc.tc_obj, &x->x_n);
    while (argc && argv->a_type == A_SYMBOL &&
        *argv->a_w.w_symbol->s_name == '-')
    {
        if (!strcmp(argv->a_w.w_symbol->s_name, "-s") &&
            argc >= 3 && argv[1].a_type == A_SYMBOL &&
                argv[2].a_type == A_SYMBOL)
        {
            x->x_struct = canvas_makebindsym(argv[1].a_w.w_symbol);
            x->x_field = argv[2].a_w.w_symbol;
            argc -= 2; argv += 2;
        }
        else if (!strcmp(argv->a_w.w_symbol->s_name, "-f") &&
            argc >= 3 && argv[1].a_type == A_SYMBOL &&
                argv[2].a_type == A_SYMBOL)
        {
            x->x_elemtemplate = argv[1].a_w.w_symbol;
            x->x_elemfield = argv[2].a_w.w_symbol;
            argc -= 2; argv += 2;
        }
        else
        {
            pd_error(x, "%s: unknown flag ...", class_getname(class));
            postatom(argc, argv); endpost();
        }
        argc--; argv++;
    }
    if (argc && argv->a_type == A_SYMBOL)
    {
        if (x->x_struct)
        {
            pd_error(x, "%s: extra names after -s..", class_getname(class));
            postatom(argc, argv); endpost();
        }
        else x->x_sym = argv->a_w.w_symbol;
        argc--; argv++;
    }
    if (argc && argv->a_type == A_FLOAT)
    {
        x->x_onset = argv->a_w.w_float;
        argc--; argv++;
    }
    if (argc && argv->a_type == A_FLOAT)
    {
        x->x_n = argv->a_w.w_float;
        argc--; argv++;
    }
    if (argc && warnextra)
    {
        post("warning: %s ignoring extra argument: ", class_getname(class));
        postatom(argc, argv); endpost();
    }
    if (x->x_struct)
        pointerinlet_new(&x->x_tc.tc_obj, &x->x_gp);
    else symbolinlet_new(&x->x_tc.tc_obj, &x->x_tc.tc_sym);
    *argcp = argc;
    *argvp = argv;
    return (x);
}